

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_bytep *pppVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 *ptr;
  png_byte pVar5;
  png_byte pVar6;
  png_byte pVar7;
  png_bytep ppVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  png_voidp pvVar12;
  long *plVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  png_byte pVar22;
  uint uVar23;
  png_colorp ppVar24;
  png_colorp ppVar25;
  byte *pbVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  png_byte *ppVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  png_color tmp_color;
  long local_58;
  png_byte *local_50;
  
  uVar14 = (ulong)(uint)num_palette;
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) != 0) {
      png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
      return;
    }
    png_ptr->flags = png_ptr->flags | 0x4000;
    *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations | 0x40;
    if (full_quantize == 0) {
      ppVar8 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
      png_ptr->quantize_index = ppVar8;
      if (0 < num_palette) {
        uVar9 = 0;
        do {
          png_ptr->quantize_index[uVar9] = (png_byte)uVar9;
          uVar9 = uVar9 + 1;
        } while ((uint)num_palette != uVar9);
      }
    }
    if (maximum_colors < num_palette) {
      uVar9 = (ulong)(uint)num_palette;
      ppVar8 = (png_bytep)png_malloc(png_ptr,uVar9);
      if (histogram == (png_const_uint_16p)0x0) {
        png_ptr->index_to_palette = ppVar8;
        ppVar8 = (png_bytep)png_malloc(png_ptr,uVar9);
        png_ptr->palette_to_index = ppVar8;
        if (0 < num_palette) {
          uVar10 = 0;
          do {
            png_ptr->index_to_palette[uVar10] = (png_byte)uVar10;
            png_ptr->palette_to_index[uVar10] = (png_byte)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        pppVar1 = &png_ptr->index_to_palette;
        pvVar12 = png_calloc(png_ptr,0x1808);
        if (maximum_colors < num_palette) {
          uVar19 = 0x60;
          local_58 = 0x61;
          puVar11 = (undefined8 *)0x0;
          do {
            iVar18 = (int)uVar14;
            iVar31 = 1;
            if (1 < iVar18) {
              iVar31 = iVar18;
            }
            iVar33 = 2;
            uVar10 = 0;
            local_50 = &palette[1].blue;
            do {
              if (uVar10 == iVar31 - 1) break;
              ppVar24 = palette + uVar10;
              ppVar36 = local_50;
              iVar34 = iVar33;
              do {
                uVar16 = (uint)ppVar24->red - (uint)((png_color *)(ppVar36 + -2))->red;
                uVar23 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar23 = uVar16;
                }
                uVar27 = (uint)ppVar24->green - (uint)ppVar36[-1];
                uVar16 = -uVar27;
                if (0 < (int)uVar27) {
                  uVar16 = uVar27;
                }
                uVar28 = (uint)ppVar24->blue - (uint)*ppVar36;
                uVar27 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar27 = uVar28;
                }
                uVar23 = (uVar27 & 0xff) + (uVar16 & 0xff) + (uVar23 & 0xff);
                bVar39 = true;
                if (uVar23 <= uVar19) {
                  puVar11 = (undefined8 *)png_malloc_warn(png_ptr,0x10);
                  bVar39 = puVar11 == (undefined8 *)0x0;
                  if (bVar39) {
                    puVar11 = (undefined8 *)0x0;
                  }
                  else {
                    *puVar11 = *(undefined8 *)((long)pvVar12 + (ulong)uVar23 * 8);
                    *(char *)(puVar11 + 1) = (char)uVar10;
                    *(char *)((long)puVar11 + 9) = (char)iVar34 + -1;
                    *(undefined8 **)((long)pvVar12 + (ulong)uVar23 * 8) = puVar11;
                  }
                  bVar39 = !bVar39;
                }
                if (!bVar39) break;
                ppVar36 = ppVar36 + 3;
                bVar39 = iVar34 < iVar18;
                iVar34 = iVar34 + 1;
              } while (bVar39);
              iVar33 = iVar33 + 1;
              local_50 = local_50 + 3;
              uVar10 = uVar10 + 1;
            } while (puVar11 != (undefined8 *)0x0);
            if (puVar11 != (undefined8 *)0x0) {
              lVar38 = 0;
              do {
                plVar13 = *(long **)((long)pvVar12 + lVar38 * 8);
                if (plVar13 != (long *)0x0) {
                  do {
                    ppVar8 = *pppVar1;
                    bVar2 = *(byte *)(plVar13 + 1);
                    iVar31 = (int)uVar14;
                    if (((int)(uint)ppVar8[bVar2] < iVar31) &&
                       (bVar3 = *(byte *)((long)plVar13 + 9), (int)(uint)ppVar8[bVar3] < iVar31)) {
                      bVar15 = bVar2;
                      if ((uVar14 & 1) == 0) {
                        bVar15 = bVar3;
                      }
                      uVar23 = iVar31 - 1;
                      uVar10 = (ulong)uVar23;
                      bVar4 = ppVar8[bVar15];
                      palette[bVar4].blue = palette[uVar10].blue;
                      pVar22 = palette[uVar10].green;
                      palette[bVar4].red = palette[uVar10].red;
                      palette[bVar4].green = pVar22;
                      if (0 < num_palette && full_quantize == 0) {
                        if ((uVar14 & 1) == 0) {
                          bVar3 = bVar2;
                        }
                        uVar14 = 0;
                        do {
                          if (png_ptr->quantize_index[uVar14] == png_ptr->index_to_palette[bVar15])
                          {
                            png_ptr->quantize_index[uVar14] = png_ptr->index_to_palette[bVar3];
                          }
                          if (uVar23 == png_ptr->quantize_index[uVar14]) {
                            png_ptr->quantize_index[uVar14] = (*pppVar1)[bVar15];
                          }
                          uVar14 = uVar14 + 1;
                        } while (uVar9 != uVar14);
                      }
                      png_ptr->index_to_palette[png_ptr->palette_to_index[uVar10]] =
                           png_ptr->index_to_palette[bVar15];
                      png_ptr->palette_to_index[png_ptr->index_to_palette[bVar15]] =
                           png_ptr->palette_to_index[uVar10];
                      png_ptr->index_to_palette[bVar15] = (png_byte)uVar23;
                      png_ptr->palette_to_index[uVar10] = bVar15;
                      uVar14 = uVar10;
                    }
                  } while ((maximum_colors < (int)uVar14) &&
                          (plVar13 = (long *)*plVar13, plVar13 != (long *)0x0));
                  if ((int)uVar14 <= maximum_colors) break;
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 != local_58);
            }
            lVar38 = 0;
            do {
              ptr = *(undefined8 **)((long)pvVar12 + lVar38 * 8);
              while (ptr != (undefined8 *)0x0) {
                puVar11 = (undefined8 *)*ptr;
                png_free(png_ptr,ptr);
                ptr = puVar11;
              }
              *(undefined8 *)((long)pvVar12 + lVar38 * 8) = 0;
              lVar38 = lVar38 + 1;
            } while (lVar38 != 0x301);
            uVar19 = uVar19 + 0x60;
            local_58 = local_58 + 0x60;
          } while (maximum_colors < (int)uVar14);
        }
        uVar14 = (ulong)(uint)maximum_colors;
        png_free(png_ptr,pvVar12);
        png_free(png_ptr,png_ptr->palette_to_index);
        png_free(png_ptr,png_ptr->index_to_palette);
        *pppVar1 = (png_bytep)0x0;
        png_ptr->palette_to_index = (png_bytep)0x0;
      }
      else {
        png_ptr->quantize_sort = ppVar8;
        if (0 < num_palette) {
          uVar10 = 0;
          do {
            png_ptr->quantize_sort[uVar10] = (png_byte)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        uVar10 = uVar14;
        uVar19 = num_palette;
        iVar31 = 1;
        if (1 < maximum_colors) {
          iVar31 = maximum_colors;
        }
        do {
          if ((int)uVar10 <= iVar31) break;
          bVar39 = true;
          uVar20 = 0;
          do {
            ppVar8 = png_ptr->quantize_sort;
            bVar2 = ppVar8[uVar20];
            if (histogram[bVar2] < histogram[ppVar8[uVar20 + 1]]) {
              ppVar8[uVar20] = ppVar8[uVar20 + 1];
              png_ptr->quantize_sort[uVar20 + 1] = bVar2;
              bVar39 = false;
            }
            uVar20 = uVar20 + 1;
          } while (uVar19 - 1 != uVar20);
          uVar10 = (ulong)((int)uVar10 - 1);
          uVar19 = uVar19 - 1;
        } while (!bVar39);
        if (full_quantize == 0) {
          if (0 < maximum_colors) {
            uVar14 = 0;
            iVar31 = num_palette;
            do {
              if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar14]) {
                lVar38 = (long)iVar31;
                ppVar24 = palette + iVar31;
                do {
                  ppVar25 = ppVar24;
                  lVar21 = lVar38 + -1;
                  iVar31 = iVar31 + -1;
                  ppVar24 = ppVar25 + -1;
                  lVar37 = lVar38 + -1;
                  lVar38 = lVar21;
                } while ((byte)maximum_colors <= png_ptr->quantize_sort[lVar37]);
                pVar22 = ppVar25[-1].blue;
                pVar6 = ppVar24->red;
                pVar7 = ppVar24->green;
                ppVar25[-1].blue = palette[uVar14].blue;
                pVar5 = palette[uVar14].green;
                ppVar24->red = palette[uVar14].red;
                ppVar24->green = pVar5;
                palette[uVar14].red = pVar6;
                palette[uVar14].green = pVar7;
                palette[uVar14].blue = pVar22;
                png_ptr->quantize_index[lVar21] = (png_byte)uVar14;
                png_ptr->quantize_index[uVar14] = (png_byte)iVar31;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != (uint)maximum_colors);
          }
          if (0 < num_palette) {
            uVar14 = 0;
            do {
              bVar2 = png_ptr->quantize_index[uVar14];
              if (maximum_colors <= (int)(uint)bVar2) {
                uVar10 = 0;
                pVar22 = '\0';
                if (1 < maximum_colors) {
                  iVar18 = (uint)palette[bVar2].green - (uint)palette->green;
                  iVar31 = -iVar18;
                  if (0 < iVar18) {
                    iVar31 = iVar18;
                  }
                  iVar33 = (uint)palette[bVar2].red - (uint)palette->red;
                  iVar18 = -iVar33;
                  if (0 < iVar33) {
                    iVar18 = iVar33;
                  }
                  iVar34 = (uint)palette[bVar2].blue - (uint)palette->blue;
                  iVar33 = -iVar34;
                  if (0 < iVar34) {
                    iVar33 = iVar34;
                  }
                  iVar33 = iVar33 + iVar18 + iVar31;
                  uVar20 = 1;
                  ppVar36 = &palette[1].blue;
                  do {
                    iVar18 = (uint)palette[bVar2].red - (uint)((png_color *)(ppVar36 + -2))->red;
                    iVar31 = -iVar18;
                    if (0 < iVar18) {
                      iVar31 = iVar18;
                    }
                    iVar34 = (uint)palette[bVar2].green - (uint)ppVar36[-1];
                    iVar18 = -iVar34;
                    if (0 < iVar34) {
                      iVar18 = iVar34;
                    }
                    iVar32 = (uint)palette[bVar2].blue - (uint)*ppVar36;
                    iVar34 = -iVar32;
                    if (0 < iVar32) {
                      iVar34 = iVar32;
                    }
                    iVar34 = iVar34 + iVar18 + iVar31;
                    if (iVar34 < iVar33) {
                      uVar10 = uVar20 & 0xffffffff;
                      iVar33 = iVar34;
                    }
                    pVar22 = (png_byte)uVar10;
                    uVar20 = uVar20 + 1;
                    ppVar36 = ppVar36 + 3;
                  } while ((uint)maximum_colors != uVar20);
                }
                png_ptr->quantize_index[uVar14] = pVar22;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar9);
          }
        }
        else if (0 < maximum_colors) {
          ppVar8 = png_ptr->quantize_sort;
          uVar9 = 0;
          do {
            if (maximum_colors <= (int)(uint)ppVar8[uVar9]) {
              ppVar24 = palette + (int)uVar14;
              pbVar26 = ppVar8 + (long)(int)uVar14 + -1;
              do {
                ppVar25 = ppVar24;
                ppVar24 = ppVar25 + -1;
                uVar14 = (ulong)((int)uVar14 - 1);
                bVar2 = *pbVar26;
                pbVar26 = pbVar26 + -1;
              } while ((byte)maximum_colors <= bVar2);
              palette[uVar9].blue = ppVar25[-1].blue;
              pVar22 = ppVar24->green;
              palette[uVar9].red = ppVar24->red;
              palette[uVar9].green = pVar22;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)maximum_colors);
        }
        uVar14 = (ulong)(uint)maximum_colors;
        png_free(png_ptr,png_ptr->quantize_sort);
        png_ptr->quantize_sort = (png_bytep)0x0;
      }
    }
    else {
      uVar14 = (ulong)(uint)num_palette;
    }
    if (png_ptr->palette == (png_colorp)0x0) {
      png_ptr->palette = palette;
    }
    png_ptr->num_palette = (png_uint_16)uVar14;
    if (full_quantize != 0) {
      ppVar8 = (png_bytep)png_calloc(png_ptr,0x8000);
      png_ptr->palette_lookup = ppVar8;
      pvVar12 = png_malloc(png_ptr,0x8000);
      memset(pvVar12,0xff,0x8000);
      if (0 < (int)uVar14) {
        uVar9 = 0;
        do {
          bVar2 = palette[uVar9].red >> 3;
          uVar19 = (uint)(palette[uVar9].green >> 3);
          uVar23 = (uint)(palette[uVar9].blue >> 3);
          lVar38 = 0;
          uVar10 = 0;
          do {
            uVar16 = (int)uVar10 - (uint)bVar2;
            if (uVar10 <= bVar2) {
              uVar16 = (uint)bVar2 - (int)uVar10;
            }
            uVar20 = 0;
            lVar37 = lVar38;
            do {
              uVar27 = (int)uVar20 - uVar19;
              if (uVar20 <= uVar19) {
                uVar27 = uVar19 - (int)uVar20;
              }
              uVar28 = uVar27;
              if ((int)uVar27 < (int)uVar16) {
                uVar28 = uVar16;
              }
              uVar29 = 0;
              uVar17 = uVar23;
              do {
                uVar30 = (int)uVar29 - uVar23;
                if (uVar29 <= uVar23) {
                  uVar30 = uVar17;
                }
                uVar35 = uVar30;
                if ((int)uVar30 < (int)uVar28) {
                  uVar35 = uVar28;
                }
                iVar31 = uVar30 + uVar16 + uVar27 + uVar35;
                if (iVar31 < (int)(uint)*(byte *)((long)pvVar12 + uVar29 + lVar37)) {
                  *(char *)((long)pvVar12 + uVar29 + lVar37) = (char)iVar31;
                  png_ptr->palette_lookup[uVar29 + lVar37] = (png_byte)uVar9;
                }
                uVar29 = uVar29 + 1;
                uVar17 = uVar17 - 1;
              } while (uVar29 != 0x20);
              uVar20 = uVar20 + 1;
              lVar37 = lVar37 + 0x20;
            } while (uVar20 != 0x20);
            uVar10 = uVar10 + 1;
            lVar38 = lVar38 + 0x400;
          } while (uVar10 != 0x20);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar14);
      }
      png_free(png_ptr,pvVar12);
      return;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_uint_32)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_uint_32)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      png_size_t num_entries = ((png_size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_uint_32)(num_entries * (sizeof (png_byte))));

      distance = (png_bytep)png_malloc(png_ptr, (png_uint_32)(num_entries *
          (sizeof (png_byte))));

      memset(distance, 0xff, num_entries * (sizeof (png_byte)));

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}